

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldStateTest::MakeRepeatedDirty
          (MapFieldStateTest *this,MapFieldType *map_field)

{
  int in_R8D;
  
  MakeMapDirty(this,map_field);
  MapFieldBase::MutableRepeatedField((MapFieldBase *)map_field);
  if ((map_field->super_TypeDefinedMapFieldBase<int,_int>).field_0.map_.
      super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_buckets_ != 1) {
    UntypedMapBase::ClearTableImpl
              ((UntypedMapBase *)&(map_field->super_TypeDefinedMapFieldBase<int,_int>).field_0.map_,
               true);
  }
  Expect((MapFieldStateTest *)map_field,(MapFieldType *)0x2,CLEAN,1,in_R8D);
  return;
}

Assistant:

void MakeRepeatedDirty(MapFieldType* map_field) {
    MakeMapDirty(map_field);
    MapFieldBase* map_field_base = map_field;
    map_field_base->MutableRepeatedField();
    // We use map_ because we don't want to disturb the syncing
    map_field->map_.clear();

    Expect(map_field, REPEATED_DIRTY, 0, 1);
  }